

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O1

void Vec_BitSetEntry(Vec_Bit_t *p,int i,int Entry)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  byte bVar4;
  uint uVar5;
  size_t __size;
  int iVar6;
  int iVar7;
  
  if (i < p->nSize) goto LAB_00660cf2;
  uVar5 = i + 1;
  uVar1 = p->nCap;
  iVar6 = (int)uVar5 >> 5;
  if (i < (int)(uVar1 * 2)) {
    if (SBORROW4(uVar1,uVar1 * 2) != 0 < (int)uVar1 && (int)uVar1 <= i) {
      uVar2 = uVar1 & 0xf;
      iVar7 = (int)uVar1 >> 4;
LAB_00660c27:
      iVar7 = (iVar7 + 1) - (uint)(uVar2 == 0);
      __size = (long)iVar7 << 2;
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(__size);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,__size);
      }
      p->pArray = piVar3;
      if (piVar3 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
      }
      p->nCap = iVar7 * 0x20;
    }
  }
  else if ((int)uVar1 <= i) {
    uVar2 = uVar5 & 0x1f;
    iVar7 = iVar6;
    goto LAB_00660c27;
  }
  uVar1 = p->nSize;
  if (i < (int)uVar1) {
    __assert_fail("p->nSize < nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                  ,0x19a,"void Vec_BitFillExtra(Vec_Bit_t *, int, int)");
  }
  iVar7 = (int)uVar1 >> 5;
  bVar4 = (byte)uVar5;
  if (iVar7 == iVar6) {
    p->pArray[iVar6] =
         p->pArray[iVar6] & ~(~(-1 << (bVar4 - (byte)uVar1 & 0x1f)) << ((byte)uVar1 & 0x1f));
  }
  else {
    piVar3 = p->pArray;
    piVar3[iVar7] = piVar3[iVar7] & (-(uint)((uVar1 & 0x1f) == 0) | ~(-1 << (sbyte)(uVar1 & 0x1f)));
    piVar3[iVar6] = ((uint)piVar3[iVar6] >> (bVar4 & 0x1f)) << (bVar4 & 0x1f);
    if (iVar7 + 1 < iVar6) {
      memset(piVar3 + (long)iVar7 + 1,0,(ulong)((iVar6 - iVar7) - 2) * 4 + 4);
    }
  }
  p->nSize = uVar5;
LAB_00660cf2:
  if ((-1 < i) && (i < p->nSize)) {
    p->pArray[(uint)i >> 5] = p->pArray[(uint)i >> 5] | 1 << ((byte)i & 0x1f);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
}

Assistant:

static inline void Vec_BitSetEntry( Vec_Bit_t * p, int i, int Entry )
{
    Vec_BitFillExtra( p, i + 1, 0 );
    Vec_BitWriteEntry( p, i, Entry );
}